

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O1

int __thiscall
fmt::v6::internal::
arg_map<fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<wchar_t>_>,_wchar_t>_>
::init(arg_map<fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<wchar_t>_>,_wchar_t>_>
       *this,EVP_PKEY_CTX *ctx)

{
  int iVar1;
  undefined4 uVar2;
  type tVar3;
  undefined4 uVar4;
  uint uVar5;
  undefined8 *puVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  entry *peVar9;
  size_t sVar10;
  int in_EAX;
  entry *peVar11;
  byte bVar12;
  int shift;
  ulong uVar13;
  ulong uVar14;
  ulong uVar15;
  
  if (this->map_ != (entry *)0x0) {
    return in_EAX;
  }
  uVar13 = *(ulong *)ctx;
  uVar15 = 0xc;
  if ((long)uVar13 < 0) {
    uVar15 = uVar13 & 0xffffffff;
  }
  peVar11 = (entry *)operator_new__(uVar15 * 0x30);
  if ((int)uVar15 != 0) {
    uVar14 = 0;
    do {
      *(undefined4 *)((long)&(peVar11->arg).type_ + uVar14) = 0;
      puVar6 = (undefined8 *)((long)&(peVar11->name).data_ + uVar14);
      *puVar6 = 0;
      puVar6[1] = 0;
      *(undefined4 *)((long)&(peVar11->arg).value_.field_0 + uVar14) = 0;
      uVar14 = uVar14 + 0x30;
    } while (uVar15 * 0x30 != uVar14);
  }
  this->map_ = peVar11;
  if ((long)uVar13 < 0) {
    if (0 < (int)(uint)uVar13) {
      uVar13 = (ulong)((uint)uVar13 & 0x7fffffff);
      peVar11 = (entry *)0x10;
      do {
        if (*(int *)((long)peVar11 + *(long *)(ctx + 8)) == 1) {
          puVar6 = *(undefined8 **)(*(long *)(ctx + 8) + -0x10 + (long)peVar11);
          iVar1 = *(int *)(puVar6 + 2);
          uVar2 = *(undefined4 *)((long)puVar6 + 0x1c);
          uVar7 = *(undefined8 *)((long)puVar6 + 0x14);
          tVar3 = *(type *)(puVar6 + 4);
          uVar4 = *(undefined4 *)((long)puVar6 + 0x2c);
          uVar8 = *(undefined8 *)((long)puVar6 + 0x24);
          peVar9 = this->map_;
          uVar5 = this->size_;
          sVar10 = puVar6[1];
          peVar9[uVar5].name.data_ = (wchar_t *)*puVar6;
          peVar9[uVar5].name.size_ = sVar10;
          peVar9[uVar5].arg.value_.field_0.int_value = iVar1;
          *(undefined4 *)((long)&peVar9[uVar5].arg.value_.field_0 + 0xc) = uVar2;
          *(undefined8 *)((long)&peVar9[uVar5].arg.value_.field_0.string.data + 4) = uVar7;
          peVar9[uVar5].arg.type_ = tVar3;
          *(undefined8 *)&peVar9[uVar5].arg.field_0x14 = uVar8;
          *(undefined4 *)&peVar9[uVar5].arg.field_0x1c = uVar4;
          this->size_ = this->size_ + 1;
        }
        peVar11 = (entry *)((long)peVar11 + 0x20);
        uVar13 = uVar13 - 1;
      } while (uVar13 != 0);
    }
LAB_001851ce:
    return (int)peVar11;
  }
  peVar11 = (entry *)0x0;
  bVar12 = 0;
  do {
    uVar13 = *(ulong *)ctx >> (bVar12 & 0x3f);
    if (((uint)uVar13 & 0x1f) == 1) {
      puVar6 = *(undefined8 **)((long)&(peVar11->name).data_ + *(long *)(ctx + 8));
      iVar1 = *(int *)(puVar6 + 2);
      uVar2 = *(undefined4 *)((long)puVar6 + 0x1c);
      uVar7 = *(undefined8 *)((long)puVar6 + 0x14);
      tVar3 = *(type *)(puVar6 + 4);
      uVar4 = *(undefined4 *)((long)puVar6 + 0x2c);
      uVar8 = *(undefined8 *)((long)puVar6 + 0x24);
      peVar9 = this->map_;
      uVar5 = this->size_;
      sVar10 = puVar6[1];
      peVar9[uVar5].name.data_ = (wchar_t *)*puVar6;
      peVar9[uVar5].name.size_ = sVar10;
      peVar9[uVar5].arg.value_.field_0.int_value = iVar1;
      *(undefined4 *)((long)&peVar9[uVar5].arg.value_.field_0 + 0xc) = uVar2;
      *(undefined8 *)((long)&peVar9[uVar5].arg.value_.field_0.string.data + 4) = uVar7;
      peVar9[uVar5].arg.type_ = tVar3;
      *(undefined8 *)&peVar9[uVar5].arg.field_0x14 = uVar8;
      *(undefined4 *)&peVar9[uVar5].arg.field_0x1c = uVar4;
      this->size_ = this->size_ + 1;
    }
    else if ((uVar13 & 0x1f) == 0) goto LAB_001851ce;
    bVar12 = bVar12 + 5;
    peVar11 = (entry *)&peVar11->arg;
  } while( true );
}

Assistant:

void arg_map<Context>::init(const basic_format_args<Context>& args) {
  if (map_) return;
  map_ = new entry[internal::to_unsigned(args.max_size())];
  if (args.is_packed()) {
    for (int i = 0;; ++i) {
      internal::type arg_type = args.type(i);
      if (arg_type == internal::type::none_type) return;
      if (arg_type == internal::type::named_arg_type)
        push_back(args.values_[i]);
    }
  }
  for (int i = 0, n = args.max_size(); i < n; ++i) {
    auto type = args.args_[i].type_;
    if (type == internal::type::named_arg_type) push_back(args.args_[i].value_);
  }
}